

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plane.cpp
# Opt level: O1

void __thiscall Plane::input(Plane *this,string *var,stringstream *ss)

{
  int iVar1;
  Vector3 *vec;
  
  iVar1 = std::__cxx11::string::compare((char *)var);
  if (iVar1 == 0) {
    vec = &this->Dx;
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)var);
    if (iVar1 == 0) {
      vec = &this->Dy;
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)var);
      if (iVar1 != 0) {
        iVar1 = std::__cxx11::string::compare((char *)var);
        if (iVar1 == 0) {
          std::istream::_M_extract<double>((double *)ss);
        }
        else {
          Primitive::input(&this->super_Primitive,var,ss);
        }
        goto LAB_0010e8bb;
      }
      vec = &this->N;
    }
  }
  operator>>(ss,vec);
LAB_0010e8bb:
  (*(this->super_Primitive)._vptr_Primitive[1])(this);
  return;
}

Assistant:

void Plane::input(const std::string &var, std::stringstream &ss) {
    if (var == "Dx=") ss >> Dx;
    else if (var == "Dy=") ss >> Dy;
    else if (var == "N=") ss >> N;
    else if (var == "R=") ss >> r;
    else Primitive::input(var, ss);
    init();
}